

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O1

Min_Cube_t * Min_SopComplement(Min_Man_t *p,Min_Cube_t *pSharp)

{
  uint uVar1;
  long lVar2;
  Min_Cube_t **ppMVar3;
  Min_Cube_t **ppMVar4;
  uint uVar5;
  uint *__ptr;
  void *pvVar6;
  Min_Cube_t *pMVar7;
  Min_Cube_t *pMVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  Min_Cube_t *pMVar14;
  long lVar15;
  Min_Cube_t *pMVar16;
  uint uVar17;
  uint *__s;
  int iVar18;
  Min_Cube_t *pCover;
  undefined1 local_58 [16];
  Min_Cube_t *local_48;
  uint *local_40;
  int *local_38;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar6 = malloc(400);
  *(void **)(__ptr + 2) = pvVar6;
  pMVar7 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
  pMVar7->pNext = (Min_Cube_t *)0x0;
  uVar5 = p->nVars & 0x3ff;
  *(uint *)&pMVar7->field_0x8 = *(uint *)&pMVar7->field_0x8 & 0xfffffc00 | uVar5;
  *(uint *)&pMVar7->field_0x8 = (p->nWords & 0xfffU) << 10 | uVar5;
  memset(pMVar7->uData,0xff,(long)p->nWords << 2);
  local_58._0_8_ = pMVar7;
  for (; pSharp != (Min_Cube_t *)0x0; pSharp = pSharp->pNext) {
    if ((Min_Cube_t *)local_58._0_8_ != (Min_Cube_t *)0x0) {
      pMVar7 = (Min_Cube_t *)local_58;
      pMVar8 = (Min_Cube_t *)local_58._0_8_;
      local_58._8_8_ = pSharp;
      do {
        uVar5 = *(uint *)&pSharp->field_0x8;
        if (((uVar5 ^ *(uint *)&pMVar8->field_0x8) & 0x3ff) != 0) {
          __assert_fail("pCube0->nVars == pCube1->nVars",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covInt.h"
                        ,299,"int Min_CubesDisjoint(Min_Cube_t *, Min_Cube_t *)");
        }
        uVar9 = *(uint *)&pMVar8->field_0x8 >> 10 & 0xfff;
        if (uVar9 != 0) {
          uVar11 = 0;
          do {
            uVar12 = pSharp->uData[uVar11] & pMVar8->uData[uVar11];
            if ((~(uVar12 >> 1 | uVar12) & 0x55555555) != 0) goto LAB_003d362e;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        local_48 = pMVar8->pNext;
        __ptr[1] = 0;
        if ((uVar5 & 0x3ffc00) != 0) {
          iVar10 = 0;
          uVar11 = 0;
          do {
            uVar5 = pMVar8->uData[uVar11] >> 1 & pMVar8->uData[uVar11] &
                    (pSharp->uData[uVar11] >> 1 ^ pSharp->uData[uVar11]) & 0x55555555;
            if (uVar5 != 0) {
              uVar9 = 0xfffffffe;
              iVar18 = iVar10;
              do {
                if ((uVar5 >> (uVar9 + 2 & 0x1f) & 1) != 0) {
                  uVar12 = __ptr[1];
                  uVar1 = *__ptr;
                  if (uVar12 == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar6 = malloc(0x40);
                      }
                      else {
                        pvVar6 = realloc(*(void **)(__ptr + 2),0x40);
                      }
                      *(void **)(__ptr + 2) = pvVar6;
                      uVar17 = 0x10;
                    }
                    else {
                      uVar17 = uVar1 * 2;
                      if ((int)uVar17 <= (int)uVar1) goto LAB_003d3450;
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar6 = malloc((ulong)uVar1 << 3);
                      }
                      else {
                        pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 3);
                      }
                      *(void **)(__ptr + 2) = pvVar6;
                    }
                    if (pvVar6 == (void *)0x0) {
                      __assert_fail("p->pArray",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                    }
                    *__ptr = uVar17;
                  }
LAB_003d3450:
                  __ptr[1] = uVar12 + 1;
                  *(int *)(*(long *)(__ptr + 2) + (long)(int)uVar12 * 4) = iVar18;
                }
                uVar9 = uVar9 + 2;
                iVar18 = iVar18 + 1;
              } while (uVar9 < 0x1e);
            }
            uVar11 = uVar11 + 1;
            iVar10 = iVar10 + 0x10;
            pSharp = (Min_Cube_t *)local_58._8_8_;
          } while (uVar11 < (*(uint *)(local_58._8_8_ + 8) >> 10 & 0xfff));
        }
        lVar15 = (long)(int)__ptr[1];
        if (0 < lVar15) {
          lVar2 = *(long *)(__ptr + 2);
          iVar10 = *(int *)(lVar2 + -4 + lVar15 * 4);
          lVar13 = lVar15 + -1;
          pMVar8->uData[iVar10 >> 4] =
               pMVar8->uData[iVar10 >> 4] ^ 3 << ((char)iVar10 * '\x02' & 0x1fU);
          if (lVar13 != 0) {
            lVar2 = lVar2 + lVar15 * 4;
            __s = pMVar8->uData;
            pMVar16 = pMVar8;
            do {
              local_38 = (int *)(lVar2 + -4);
              iVar10 = *local_38;
              uVar5 = __s[iVar10 >> 4];
              local_40 = __s;
              pMVar8 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
              pMVar8->pNext = (Min_Cube_t *)0x0;
              uVar9 = p->nVars & 0x3ff;
              *(uint *)&pMVar8->field_0x8 = *(uint *)&pMVar8->field_0x8 & 0xfffffc00 | uVar9;
              uVar9 = (p->nWords & 0xfffU) << 10 | uVar9;
              *(uint *)&pMVar8->field_0x8 = uVar9;
              __s = pMVar8->uData;
              memset(__s,0xff,(long)p->nWords << 2);
              memcpy(__s,local_40,(long)p->nWords << 2);
              *(uint *)&pMVar8->field_0x8 = *(uint *)&pMVar16->field_0x8 & 0xffc00000 | uVar9;
              pMVar8->uData[*local_38 >> 4] =
                   pMVar8->uData[*local_38 >> 4] ^
                   (~(uVar5 >> ((char)iVar10 * '\x02' & 0x1fU)) & 3) <<
                   ((char)*local_38 * '\x02' & 0x1fU);
              pMVar7->pNext = pMVar8;
              iVar10 = *(int *)(*(long *)(__ptr + 2) + -8 + lVar15 * 4);
              lVar2 = *(long *)(__ptr + 2) + lVar13 * 4;
              lVar13 = lVar13 + -1;
              pMVar8->uData[iVar10 >> 4] =
                   pMVar8->uData[iVar10 >> 4] ^ 3 << ((char)iVar10 * '\x02' & 0x1fU);
              lVar15 = lVar15 + -1;
              pMVar7 = pMVar8;
              pMVar16 = pMVar8;
            } while (lVar15 != 1);
          }
        }
        pMVar8->pNext = local_48;
        pSharp = (Min_Cube_t *)local_58._8_8_;
LAB_003d362e:
        pMVar7 = pMVar8;
        pMVar8 = pMVar7->pNext;
      } while (pMVar8 != (Min_Cube_t *)0x0);
    }
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  pMVar7 = (Min_Cube_t *)local_58._0_8_;
  if ((Min_Cube_t *)local_58._0_8_ == (Min_Cube_t *)0x0) {
    Min_ManClean(p,p->nVars);
LAB_003d3728:
    Min_SopDist1Merge(p);
    Min_SopContain(p);
    pMVar7 = Min_CoverCollect(p,p->nVars);
    return pMVar7;
  }
  Min_ManClean(p,*(uint *)(local_58._0_8_ + 8) & 0x3ff);
  pMVar8 = *&pMVar7->pNext;
  do {
    pMVar16 = pMVar8;
    ppMVar3 = p->ppStore;
    uVar5 = *(uint *)&pMVar7->field_0x8 >> 0x16;
    pMVar8 = ppMVar3[uVar5];
    if (pMVar8 == (Min_Cube_t *)0x0) {
LAB_003d36d5:
      pMVar7->pNext = pMVar8;
      ppMVar3[uVar5] = pMVar7;
      p->nCubes = p->nCubes + 1;
    }
    else {
      uVar9 = *(uint *)&pMVar7->field_0x8 >> 10 & 0xfff;
      pMVar14 = pMVar8;
      if (uVar9 != 0) {
        do {
          uVar11 = 0;
          while (pMVar7->uData[uVar11] == pMVar14->uData[uVar11]) {
            uVar11 = uVar11 + 1;
            if (uVar9 == uVar11) goto LAB_003d36e6;
          }
          ppMVar4 = &pMVar14->pNext;
          pMVar14 = *ppMVar4;
        } while (*ppMVar4 != (Min_Cube_t *)0x0);
        goto LAB_003d36d5;
      }
LAB_003d36e6:
      Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar7);
    }
    if (pMVar16 == (Min_Cube_t *)0x0) goto LAB_003d3728;
    pMVar8 = pMVar16->pNext;
    pMVar7 = pMVar16;
  } while( true );
}

Assistant:

Min_Cube_t * Min_SopComplement( Min_Man_t * p, Min_Cube_t * pSharp )
{
     Vec_Int_t * vVars;
     Min_Cube_t * pCover, * pCube, * pNext, * pReady, * pThis, ** ppPrev;
     int Num, Value, i;

     // get the variables
     vVars = Vec_IntAlloc( 100 );
    // create the tautology cube
     pCover = Min_CubeAlloc( p );
     // sharp it with all cubes
     Min_CoverForEachCube( pSharp, pCube )
     Min_CoverForEachCubePrev( pCover, pThis, ppPrev )
     {
        if ( Min_CubesDisjoint( pThis, pCube ) )
            continue;
        // remember the next pointer
        pNext = pThis->pNext;
        // get the variables, in which pThis is '-' while pCube is fixed
        Min_CoverGetDisjVars( pThis, pCube, vVars );
        // generate the disjoint cubes
        pReady = pThis;
        Vec_IntForEachEntryReverse( vVars, Num, i )
        {
            // correct the literal
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 );
            if ( i == 0 )
                break;
            // create the new cube and clean this value
            Value = Min_CubeGetVar( pReady, vVars->pArray[i] );
            pReady = Min_CubeDup( p, pReady );
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 ^ Value );
            // add to the cover
            *ppPrev = pReady;
            ppPrev = &pReady->pNext;
        }
        pThis = pReady;
        pThis->pNext = pNext;
     }
     Vec_IntFree( vVars );

     // perform dist-1 merge and contain
     Min_CoverExpandRemoveEqual( p, pCover );
     Min_SopDist1Merge( p );
     Min_SopContain( p );
     return Min_CoverCollect( p, p->nVars );
}